

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JITexec.cpp
# Opt level: O1

bool get_jit_file(void)

{
  char cVar1;
  int iVar2;
  long *plVar3;
  void *pvVar4;
  long *plVar5;
  bool bVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ifstream in;
  long *local_288;
  long local_280;
  long local_278;
  long lStack_270;
  long *local_268 [2];
  long local_258 [2];
  long *local_248;
  long local_240;
  long local_238;
  long lStack_230;
  string local_228 [520];
  
  std::ifstream::ifstream(local_228);
  iVar2 = std::__cxx11::string::compare((char *)&Directory_abi_cxx11_);
  if (iVar2 == 0) {
    local_288 = &local_278;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_288,FileName_abi_cxx11_._M_dataplus._M_p,
               FileName_abi_cxx11_._M_dataplus._M_p + FileName_abi_cxx11_._M_string_length);
    std::__cxx11::string::append((char *)&local_288);
    std::ifstream::open(local_228,(_Ios_Openmode)&local_288);
    local_258[0] = local_278;
    plVar3 = local_288;
    if (local_288 == &local_278) goto LAB_00104278;
  }
  else {
    local_268[0] = local_258;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_268,Directory_abi_cxx11_._M_dataplus._M_p,
               Directory_abi_cxx11_._M_dataplus._M_p + Directory_abi_cxx11_._M_string_length);
    std::__cxx11::string::append((char *)local_268);
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_268,(ulong)FileName_abi_cxx11_._M_dataplus._M_p);
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_238 = *plVar5;
      lStack_230 = plVar3[3];
      local_248 = &local_238;
    }
    else {
      local_238 = *plVar5;
      local_248 = (long *)*plVar3;
    }
    local_240 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_248);
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_278 = *plVar5;
      lStack_270 = plVar3[3];
      local_288 = &local_278;
    }
    else {
      local_278 = *plVar5;
      local_288 = (long *)*plVar3;
    }
    local_280 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::ifstream::open(local_228,(_Ios_Openmode)&local_288);
    if (local_288 != &local_278) {
      operator_delete(local_288,local_278 + 1);
    }
    if (local_248 != &local_238) {
      operator_delete(local_248,local_238 + 1);
    }
    plVar3 = local_268[0];
    if (local_268[0] == local_258) goto LAB_00104278;
  }
  operator_delete(plVar3,local_258[0] + 1);
LAB_00104278:
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    bVar6 = false;
  }
  else {
    std::istream::seekg((long)local_228,_S_beg);
    iVar2 = std::istream::tellg();
    pvVar4 = operator_new__((long)iVar2);
    std::istream::seekg((long)local_228,_S_beg);
    std::istream::read((char *)local_228,(long)pvVar4);
    std::ifstream::close();
    len = *(uint *)((long)pvVar4 + 3);
    code_index = *(uint *)((long)pvVar4 + 7);
    jit_type = *(char *)((long)pvVar4 + 0xb);
    code_bin_end = *(uint *)((long)pvVar4 + 0xc);
    shellcode_begin = (char *)((long)pvVar4 + 0x10);
    bVar6 = code_index == registe_ptr->IP;
  }
  std::ifstream::~ifstream(local_228);
  return bVar6;
}

Assistant:

bool get_jit_file() {
	char *shcode_origin;
	std::ifstream in;
	if(Directory=="") in.open( FileName + ".jit", std::ifstream::in);
	else in.open(Directory+"\\"+FileName+".jit", std::ifstream::in);
	if (in.is_open()) {
		in.seekg(0, std::ios::end);//移到文件尾部
		int shcode_size = in.tellg();//获取文件大小
		shcode_origin = new char[shcode_size];
		in.seekg(0, std::ios::beg);//移到文件头部
		in.read(shcode_origin, shcode_size);
		in.close();
		len = *(unsigned*)(shcode_origin + 3);
		code_index = *(unsigned*)(shcode_origin + 7);
		jit_type = *(shcode_origin + 11);
		code_bin_end= *(unsigned*)(shcode_origin + 12);
		shellcode_begin = shcode_origin + 16;
		if(code_index==registe_ptr->IP)return true;
		else return false;
	}
	else return false;
}